

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O2

void mxx::
     stable_distribute<__gnu_cxx::__normal_iterator<std::array<unsigned_long,3ul>*,std::vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>>,__gnu_cxx::__normal_iterator<std::array<unsigned_long,3ul>*,std::vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>>>
               (__normal_iterator<std::array<unsigned_long,_3UL>_*,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
                begin,__normal_iterator<std::array<unsigned_long,_3UL>_*,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
                      end,
               __normal_iterator<std::array<unsigned_long,_3UL>_*,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
               out,comm *comm)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  unsigned_long total_size;
  unsigned_long global_index;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  block_decomposition<unsigned_long> local_48;
  
  if (comm->m_size == 1) {
    if ((long)end._M_current - (long)begin._M_current != 0) {
      memmove(out._M_current,begin._M_current,(long)end._M_current - (long)begin._M_current);
      return;
    }
  }
  else {
    local_size = ((long)end._M_current - (long)begin._M_current) / 0x18;
    total_size = allreduce<unsigned_long,std::plus<unsigned_long>>
                           (&local_size,comm,((long)end._M_current - (long)begin._M_current) % 0x18)
    ;
    if (total_size != 0) {
      bVar2 = any_of(local_size == total_size,comm);
      if (bVar2) {
        impl::
        distribute_scatter<__gnu_cxx::__normal_iterator<std::array<unsigned_long,3ul>*,std::vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>>,__gnu_cxx::__normal_iterator<std::array<unsigned_long,3ul>*,std::vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>>>
                  (begin,end,out,total_size,comm);
      }
      else {
        global_index = exscan<unsigned_long,std::plus<unsigned_long>>(&local_size,comm);
        local_48._vptr_block_decomposition = (_func_int **)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&send_counts,(long)comm->m_size,(value_type_conflict1 *)&local_48,
                   (allocator_type *)&recv_counts);
        local_48._vptr_block_decomposition = (_func_int **)&PTR__block_decomposition_001b4fd8;
        local_48.p = comm->m_size;
        local_48.rank = comm->m_rank;
        local_48.n = total_size;
        iVar3 = partition::block_decomposition<unsigned_long>::target_processor
                          (&local_48,global_index);
        sVar4 = local_size;
        uVar6 = (long)iVar3;
        while ((sVar4 != 0 && ((long)uVar6 < (long)comm->m_size))) {
          uVar5 = local_48.n % (ulong)(long)local_48.p;
          uVar1 = uVar6 + 1;
          if (uVar1 <= uVar5) {
            uVar5 = uVar1;
          }
          uVar5 = ((local_48.n / (ulong)(long)local_48.p) * uVar1 - global_index) + uVar5;
          if (sVar4 < uVar5) {
            uVar5 = sVar4;
          }
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = uVar5;
          sVar4 = sVar4 - uVar5;
          global_index = global_index + uVar5;
          uVar6 = uVar1;
        }
        all2all<unsigned_long>(&recv_counts,&send_counts,comm);
        all2allv<std::array<unsigned_long,3ul>>
                  (begin._M_current,&send_counts,out._M_current,&recv_counts,comm);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      }
    }
  }
  return;
}

Assistant:

void stable_distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if there's only one process, return a copy
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get local and global size
    std::size_t local_size = std::distance(begin, end);
    std::size_t total_size = mxx::allreduce(local_size, comm);

    if (total_size == 0) {
        return;
    }

    // one process has all elements -> use scatter instead of all2all
    if (mxx::any_of(local_size == total_size, comm)) {
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // get prefix sum of size and total size
        std::size_t prefix = mxx::exscan(local_size, comm);

        // calculate where to send elements
        std::vector<size_t> send_counts(comm.size(), 0);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        int first_p = part.target_processor(prefix);
        std::size_t left_to_send = local_size;
        for (; left_to_send > 0 && first_p < comm.size(); ++first_p) {
            std::size_t nsend = std::min<std::size_t>(part.prefix_size(first_p) - prefix, left_to_send);
            send_counts[first_p] = nsend;
            left_to_send -= nsend;
            prefix += nsend;
        }
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
        // TODO: accept iterators in mxx::all2all?
        mxx::all2allv(&(*begin), send_counts, &(*out), recv_counts, comm);
    }
}